

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O3

char * GetConfigValue(char *devName,char *blockName,char *keyName,char *def)

{
  char *__n;
  undefined8 *puVar1;
  undefined1 *__s2;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long lVar7;
  string key;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  char *local_40;
  char *local_38;
  
  if (keyName == (char *)0x0) {
    return def;
  }
  local_60 = &local_50;
  local_58 = (char *)0x0;
  local_50 = 0;
  if ((blockName == (char *)0x0) ||
     (iVar3 = al::strcasecmp(blockName,"general"), pcVar2 = local_58, iVar3 == 0)) {
    pcVar2 = local_58;
    if (devName != (char *)0x0) {
      strlen(devName);
      std::__cxx11::string::_M_replace((ulong)&local_60,0,pcVar2,(ulong)devName);
      goto LAB_0013c140;
    }
  }
  else {
    strlen(blockName);
    std::__cxx11::string::_M_replace((ulong)&local_60,0,pcVar2,(ulong)blockName);
    if (devName != (char *)0x0) {
      std::__cxx11::string::push_back((char)&local_60);
      std::__cxx11::string::append((char *)&local_60);
    }
LAB_0013c140:
    std::__cxx11::string::push_back((char)&local_60);
  }
  std::__cxx11::string::append((char *)&local_60);
  pcVar2 = local_58;
  __s2 = local_60;
  puVar1 = DAT_001b1dd8;
  uVar4 = (long)DAT_001b1dd8 - (long)(anonymous_namespace)::ConfOpts;
  puVar5 = (anonymous_namespace)::ConfOpts;
  local_40 = blockName;
  local_38 = devName;
  if (0 < (long)uVar4 >> 8) {
    puVar6 = (undefined8 *)((uVar4 & 0xffffffffffffff00) + (long)(anonymous_namespace)::ConfOpts);
    lVar7 = ((long)uVar4 >> 8) + 1;
    puVar5 = (anonymous_namespace)::ConfOpts + 0x10;
    do {
      if ((pcVar2 == (char *)puVar5[-0xf]) &&
         ((pcVar2 == (char *)0x0 ||
          (iVar3 = bcmp((void *)puVar5[-0x10],__s2,(size_t)pcVar2), iVar3 == 0)))) {
        puVar5 = puVar5 + -0x10;
        goto LAB_0013c326;
      }
      if ((pcVar2 == (char *)puVar5[-7]) &&
         ((pcVar2 == (char *)0x0 ||
          (iVar3 = bcmp((void *)puVar5[-8],__s2,(size_t)pcVar2), iVar3 == 0)))) {
        puVar5 = puVar5 + -8;
        goto LAB_0013c326;
      }
      if ((pcVar2 == (char *)puVar5[1]) &&
         ((pcVar2 == (char *)0x0 || (iVar3 = bcmp((void *)*puVar5,__s2,(size_t)pcVar2), iVar3 == 0))
         )) goto LAB_0013c326;
      if ((pcVar2 == (char *)puVar5[9]) &&
         ((pcVar2 == (char *)0x0 ||
          (iVar3 = bcmp((void *)puVar5[8],__s2,(size_t)pcVar2), iVar3 == 0)))) {
        puVar5 = puVar5 + 8;
        goto LAB_0013c326;
      }
      lVar7 = lVar7 + -1;
      puVar5 = puVar5 + 0x20;
    } while (1 < lVar7);
    uVar4 = (long)puVar1 - (long)puVar6;
    puVar5 = puVar6;
  }
  pcVar2 = local_58;
  lVar7 = (long)uVar4 >> 6;
  if (lVar7 == 3) {
    __n = (char *)puVar5[1];
    if ((local_58 != __n) ||
       ((__n != (char *)0x0 && (iVar3 = bcmp((void *)*puVar5,local_60,(size_t)__n), iVar3 != 0)))) {
      puVar5 = puVar5 + 8;
      goto LAB_0013c2cd;
    }
LAB_0013c326:
    if (puVar5 != puVar1) {
      if (2 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (II) Found %s = \"%s\"\n",local_60,puVar5[4]);
      }
      if (puVar5[5] != 0) {
        def = (char *)puVar5[4];
      }
      goto LAB_0013c371;
    }
  }
  else {
    if (lVar7 == 2) {
LAB_0013c2cd:
      if ((pcVar2 != (char *)puVar5[1]) ||
         ((pcVar2 != (char *)0x0 &&
          (iVar3 = bcmp((void *)*puVar5,local_60,(size_t)pcVar2), iVar3 != 0)))) {
        puVar5 = puVar5 + 8;
        goto LAB_0013c2f2;
      }
      goto LAB_0013c326;
    }
    if (lVar7 == 1) {
LAB_0013c2f2:
      if ((pcVar2 == (char *)puVar5[1]) &&
         ((pcVar2 == (char *)0x0 ||
          (iVar3 = bcmp((void *)*puVar5,local_60,(size_t)pcVar2), iVar3 == 0)))) goto LAB_0013c326;
    }
  }
  if (local_38 == (char *)0x0) {
    if (2 < (int)gLogLevel) {
      GetConfigValue();
    }
  }
  else {
    def = GetConfigValue((char *)0x0,local_40,keyName,def);
  }
LAB_0013c371:
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return def;
}

Assistant:

const char *GetConfigValue(const char *devName, const char *blockName, const char *keyName, const char *def)
{
    if(!keyName)
        return def;

    std::string key;
    if(blockName && al::strcasecmp(blockName, "general") != 0)
    {
        key = blockName;
        if(devName)
        {
            key += '/';
            key += devName;
        }
        key += '/';
        key += keyName;
    }
    else
    {
        if(devName)
        {
            key = devName;
            key += '/';
        }
        key += keyName;
    }

    auto iter = std::find_if(ConfOpts.cbegin(), ConfOpts.cend(),
        [&key](const ConfigEntry &entry) -> bool
        { return entry.key == key; }
    );
    if(iter != ConfOpts.cend())
    {
        TRACE("Found %s = \"%s\"\n", key.c_str(), iter->value.c_str());
        if(!iter->value.empty())
            return iter->value.c_str();
        return def;
    }

    if(!devName)
    {
        TRACE("Key %s not found\n", key.c_str());
        return def;
    }
    return GetConfigValue(nullptr, blockName, keyName, def);
}